

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall
absl::lts_20240722::flags_internal::anon_unknown_0::ReadFlagsFromEnv
          (anon_unknown_0 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *flag_names,
          vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
          *input_args,bool fail_on_absent_in_env)

{
  pointer *ppAVar1;
  char *pcVar2;
  pointer __first;
  pointer __last;
  vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
  *pvVar3;
  int iVar4;
  AlphaNum *__s;
  _Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
  *this_00;
  pointer __result;
  pointer pAVar5;
  pointer pAVar6;
  undefined7 in_register_00000009;
  AlphaNum *__alloc;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *__s_00;
  AlphaNum *__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  bool bVar7;
  char *pcVar8;
  string envval;
  string envname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char local_178;
  undefined1 local_170 [48];
  vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
  *local_140;
  char *local_138;
  char local_130 [9];
  undefined7 uStack_127;
  undefined1 local_118 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  AlphaNum local_e0;
  AlphaNum local_b0;
  undefined1 local_80 [80];
  
  __alloc = (AlphaNum *)CONCAT71(in_register_00000009,fail_on_absent_in_env);
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args = (AlphaNum *)0x10e317;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
             (char (*) [1])0x10e317);
  pcVar8 = *(char **)this;
  pcVar2 = *(char **)(this + 8);
  local_140 = (vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
               *)flag_names;
  if (pcVar8 == pcVar2) {
    bVar7 = true;
    __s_00 = extraout_RDX;
  }
  else {
    bVar7 = true;
    do {
      iVar4 = std::__cxx11::string::compare(pcVar8);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(pcVar8), iVar4 == 0)) {
        local_b0.piece_._M_len = 0x1b;
        local_b0.piece_._M_str = "Infinite recursion on flag ";
        local_e0.piece_._M_str = *(char **)pcVar8;
        __alloc = *(AlphaNum **)(pcVar8 + 8);
        local_e0.piece_._M_len = (size_t)__alloc;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_170,&local_b0);
        __args = (AlphaNum *)local_170._0_8_;
        absl::lts_20240722::flags_internal::ReportUsageError(local_170._8_8_,local_170._0_8_,1);
        __s_00 = extraout_RDX_04;
        if ((AlphaNum *)local_170._0_8_ != (AlphaNum *)(local_170 + 0x10)) {
          __args = (AlphaNum *)(local_170._16_8_ + 1);
          operator_delete((void *)local_170._0_8_,(ulong)__args);
          __s_00 = extraout_RDX_05;
        }
        bVar7 = false;
      }
      else {
        local_b0.piece_._M_len = 6;
        local_b0.piece_._M_str = "FLAGS_";
        local_e0.piece_._M_str = *(char **)pcVar8;
        __alloc = *(AlphaNum **)(pcVar8 + 8);
        __args = &local_b0;
        local_e0.piece_._M_len = (size_t)__alloc;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_118,__args);
        local_130[0] = '\0';
        local_130[1] = '\0';
        local_130[2] = '\0';
        local_130[3] = '\0';
        local_130[4] = '\0';
        local_130[5] = '\0';
        local_130[6] = '\0';
        local_130[7] = '\0';
        local_130[8] = 0;
        local_138 = local_130 + 8;
        __s = (AlphaNum *)getenv((char *)local_118._0_8_);
        __s_00 = extraout_RDX_00;
        if (__s == (AlphaNum *)0x0) {
LAB_0010a352:
          local_178 = (char)input_args;
          if (local_178 != '\0') {
            local_b0.piece_._M_len = local_118._8_8_;
            local_b0.piece_._M_str = (char *)local_118._0_8_;
            local_e0.piece_._M_len = 0x19;
            local_e0.piece_._M_str = " not found in environment";
            __alloc = (AlphaNum *)local_118._8_8_;
            absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_170,&local_b0);
            __args = (AlphaNum *)local_170._0_8_;
            absl::lts_20240722::flags_internal::ReportUsageError(local_170._8_8_,local_170._0_8_,1);
            __s_00 = extraout_RDX_06;
            if ((AlphaNum *)local_170._0_8_ != (AlphaNum *)(local_170 + 0x10)) {
              __args = (AlphaNum *)(local_170._16_8_ + 1);
              operator_delete((void *)local_170._0_8_,(ulong)__args);
              __s_00 = extraout_RDX_07;
            }
            bVar7 = false;
          }
        }
        else {
          strlen((char *)__s);
          __args = (AlphaNum *)0x0;
          __alloc = __s;
          std::__cxx11::string::_M_replace((ulong)&local_138,0,(char *)0x0,(ulong)__s);
          __s_00 = extraout_RDX_01;
          if (__s == (AlphaNum *)0x0) goto LAB_0010a352;
          local_b0.piece_._M_len = 2;
          local_b0.piece_._M_str = "--";
          local_e0.piece_._M_str = *(char **)pcVar8;
          local_e0.piece_._M_len = *(size_t *)(pcVar8 + 8);
          local_170._0_8_ = (AlphaNum *)0x1;
          local_170._8_8_ = "=";
          local_80[0x20] = local_130[0];
          local_80[0x21] = local_130[1];
          local_80[0x22] = local_130[2];
          local_80[0x23] = local_130[3];
          local_80[0x24] = local_130[4];
          local_80[0x25] = local_130[5];
          local_80[0x26] = local_130[6];
          local_80[0x27] = local_130[7];
          local_80._40_8_ = local_138;
          __args = (AlphaNum *)local_80;
          __alloc = (AlphaNum *)local_170;
          absl::lts_20240722::StrCat_abi_cxx11_(__args,&local_b0,&local_e0,__alloc);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
          __s_00 = extraout_RDX_02;
          if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
            __args = (AlphaNum *)(local_80._16_8_ + 1);
            operator_delete((void *)local_80._0_8_,(ulong)__args);
            __s_00 = extraout_RDX_03;
          }
        }
        if (local_138 != local_130 + 8) {
          __args = (AlphaNum *)(CONCAT71(uStack_127,local_130[8]) + 1);
          operator_delete(local_138,(ulong)__args);
          __s_00 = extraout_RDX_08;
        }
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          __args = (AlphaNum *)(local_118._16_8_ + 1);
          operator_delete((void *)local_118._0_8_,(ulong)__args);
          __s_00 = extraout_RDX_09;
        }
      }
      pcVar8 = pcVar8 + 0x20;
    } while (pcVar8 != pcVar2);
  }
  pvVar3 = local_140;
  if (bVar7) {
    pAVar6 = (local_140->
             super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pAVar6 == (local_140->
                  super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      this_00 = (_Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                 *)std::
                   vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                   ::_M_check_len(local_140,(size_type)__args,__s_00);
      __first = (pvVar3->
                super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                )._M_impl.super__Vector_impl_data._M_start;
      __last = (pvVar3->
               super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      __result = std::
                 _Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                 ::_M_allocate(this_00,(size_t)__args);
      this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(((long)pAVar6 - (long)__first) + (long)__result);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_01,&local_f8);
      this_01[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pAVar5 = std::
               vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
               ::_S_relocate(__first,pAVar6,__result,(_Tp_alloc_type *)__alloc);
      pAVar6 = std::
               vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
               ::_S_relocate(pAVar6,__last,pAVar5 + 1,(_Tp_alloc_type *)__alloc);
      pvVar3 = local_140;
      if (__first != (pointer)0x0) {
        operator_delete(__first,(long)(local_140->
                                      super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                                      )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)__first);
      }
      (pvVar3->
      super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
      )._M_impl.super__Vector_impl_data._M_start = __result;
      (pvVar3->
      super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
      )._M_impl.super__Vector_impl_data._M_finish = pAVar6;
      (pvVar3->
      super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&pAVar6->args_,&local_f8);
      pAVar6->next_arg_ = 0;
      ppAVar1 = &(pvVar3->
                 super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  return bVar7;
}

Assistant:

bool ReadFlagsFromEnv(const std::vector<std::string>& flag_names,
                      std::vector<ArgsList>& input_args,
                      bool fail_on_absent_in_env) {
  bool success = true;
  std::vector<std::string> args;

  // This argument represents fake argv[0], which should be present in all arg
  // lists.
  args.emplace_back("");

  for (const auto& flag_name : flag_names) {
    // Avoid infinite recursion.
    if (flag_name == "fromenv" || flag_name == "tryfromenv") {
      flags_internal::ReportUsageError(
          absl::StrCat("Infinite recursion on flag ", flag_name), true);

      success = false;
      continue;
    }

    const std::string envname = absl::StrCat("FLAGS_", flag_name);
    std::string envval;
    if (!GetEnvVar(envname.c_str(), envval)) {
      if (fail_on_absent_in_env) {
        flags_internal::ReportUsageError(
            absl::StrCat(envname, " not found in environment"), true);

        success = false;
      }

      continue;
    }

    args.push_back(absl::StrCat("--", flag_name, "=", envval));
  }

  if (success) {
    input_args.emplace_back(args);
  }

  return success;
}